

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_artifacts.cpp
# Opt level: O1

AInventory * __thiscall APowerup::CreateCopy(APowerup *this,AActor *other)

{
  int iVar1;
  int iVar2;
  
  iVar1 = *(int *)&(this->super_AInventory).field_0x4dc;
  iVar2 = -iVar1;
  if (0 < iVar1) {
    iVar2 = iVar1;
  }
  *(int *)&(this->super_AInventory).field_0x4dc = iVar2;
  (this->super_AInventory).Owner.field_0.p = other;
  (*(this->super_AInventory).super_AActor.super_DThinker.super_DObject._vptr_DObject[0x43])();
  if (((this->super_AInventory).ItemFlags & 0x8000) == 0) {
    (this->super_AInventory).Owner.field_0.p = (AActor *)0x0;
  }
  return &this->super_AInventory;
}

Assistant:

AInventory *APowerup::CreateCopy (AActor *other)
{
	// Get the effective effect time.
	EffectTics = abs (EffectTics);
	// Abuse the Owner field to tell the
	// InitEffect method who started it;
	// this should be cleared afterwards,
	// as this powerup instance is not
	// properly attached to anything yet.
	Owner = other;
	// Actually activate the powerup.
	InitEffect ();
	// Clear the Owner field, unless it was
	// changed by the activation, for example,
	// if this instance is a morph powerup;
	// the flag tells the caller that the
	// ownership has changed so that they
	// can properly handle the situation.
	if (!(ItemFlags & IF_CREATECOPYMOVED))
	{
		Owner = NULL;
	}
	// All done.
	return this;
}